

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatBQueue.h
# Opt level: O0

void xSAT_BQueuePush(xSAT_BQueue_t *p,uint Value)

{
  int iVar1;
  uint Value_local;
  xSAT_BQueue_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->iFirst != p->iEmpty) {
      __assert_fail("p->iFirst == p->iEmpty",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatBQueue.h"
                    ,99,"void xSAT_BQueuePush(xSAT_BQueue_t *, unsigned int)");
    }
    p->nSum = p->nSum - (ulong)p->pData[p->iFirst];
    p->iFirst = (p->iFirst + 1) % p->nCap;
  }
  else {
    p->nSize = p->nSize + 1;
  }
  p->nSum = (ulong)Value + p->nSum;
  p->pData[p->iEmpty] = Value;
  iVar1 = p->iEmpty + 1;
  p->iEmpty = iVar1;
  if (iVar1 == p->nCap) {
    p->iEmpty = 0;
    p->iFirst = 0;
  }
  return;
}

Assistant:

static inline void xSAT_BQueuePush( xSAT_BQueue_t * p, unsigned Value )
{
    if ( p->nSize == p->nCap )
    {
        assert(p->iFirst == p->iEmpty);
        p->nSum -= p->pData[p->iFirst];
        p->iFirst = ( p->iFirst + 1 ) % p->nCap;
    }
    else
        p->nSize++;

    p->nSum += Value;
    p->pData[p->iEmpty] = Value;
    if ( ( ++p->iEmpty ) == p->nCap )
    {
        p->iEmpty = 0;
        p->iFirst = 0;
    }
}